

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O1

void phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>
     ::transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               (allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *alloc,slot_type *new_slot,
               slot_type *old_slot)

{
  (new_slot->value).first.mDat = (proxy *)0x0;
  (new_slot->value).first.mDat = (old_slot->value).first.mDat;
  (old_slot->value).first.mDat = (proxy *)0x0;
  (new_slot->value).second.mDat = (proxy *)0x0;
  (new_slot->value).second.mDat = (old_slot->value).second.mDat;
  (old_slot->value).second.mDat = (proxy *)0x0;
  cs_impl::any::recycle(&(old_slot->value).second);
  cs_impl::any::recycle(&old_slot->key);
  return;
}

Assistant:

static void transfer(Alloc* alloc, slot_type* new_slot, slot_type* old_slot)
			{
				transfer_impl(alloc, new_slot, old_slot, 0);
			}